

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall
lest::string_maker<int*>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,string_maker<int*> *this,int *ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  size_type *psVar3;
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  undefined8 local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string local_78;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  if (this == (string_maker<int*> *)0x0) {
    std::__cxx11::string::string((string *)&local_78,"nullptr",(allocator *)&local_58);
    sVar2 = local_78._M_string_length;
    paVar1 = &local_28;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      local_28._8_8_ = local_78.field_2._8_8_;
      local_58._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_78._M_dataplus._M_p;
      local_58._M_dataplus._M_p = local_78._M_dataplus._M_p;
    }
    local_28._M_allocated_capacity._1_7_ = local_78.field_2._M_allocated_capacity._1_7_;
    local_28._M_local_buf[0] = local_78.field_2._M_local_buf[0];
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar1) {
      local_58._M_dataplus._M_p = (pointer)&local_88;
      local_88._8_8_ = local_28._8_8_;
    }
    local_88._M_allocated_capacity = local_28._M_allocated_capacity;
    psVar3 = &local_30;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    make_string<int>(&local_58,(int *)this);
    paVar1 = &local_58.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar1) {
      local_88._8_8_ = local_58.field_2._8_8_;
      local_58._M_dataplus._M_p = (pointer)&local_88;
    }
    local_88._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
    psVar3 = &local_58._M_string_length;
    sVar2 = local_58._M_string_length;
  }
  (((string *)(psVar3 + -1))->_M_dataplus)._M_p = (pointer)paVar1;
  *psVar3 = 0;
  paVar1->_M_local_buf[0] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_98 = &local_88;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == local_98) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_88._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_88._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_58._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_88._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = sVar2;
  local_90 = 0;
  local_88._M_allocated_capacity = local_88._M_allocated_capacity & 0xffffffffffffff00;
  std::__cxx11::string::~string((string *)&local_98);
  if (this == (string_maker<int*> *)0x0) {
    std::__cxx11::string::~string((string *)&local_38);
    this_00 = &local_78;
  }
  else {
    this_00 = &local_58;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string( T const * ptr )
    {
        return ! ptr ? lest_STRING( lest_nullptr ) : make_string( ptr );
    }